

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.hpp
# Opt level: O2

void __thiscall
diy::detail::KDTreePartners::KDTreePartners
          (KDTreePartners *this,int dim,int nblocks,bool wrap_,Bounds *domain_)

{
  vector<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  pointer pDVar1;
  pointer pDVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  _Vector_base<int,_std::allocator<int>_> local_148;
  _Vector_base<int,_std::allocator<int>_> local_128;
  DiscreteBounds local_108;
  _Bvector_base<std::allocator<bool>_> local_88;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  interval(&local_108,0,nblocks + -1);
  local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_58._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
  local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_58._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
  local_58._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  local_88._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  local_88._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_88._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  local_88._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
  local_88._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)0x0;
  local_88._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  local_88._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ = 0;
  local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RegularDecomposer<diy::Bounds<int>_>::RegularDecomposer
            (&this->decomposer,1,&local_108,nblocks,(BoolVector *)&local_58,(BoolVector *)&local_88,
             (CoordinateVector *)&local_128,(DivisionsVector *)&local_148);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_148);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_128);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_88);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  Bounds<int>::~Bounds(&local_108);
  RegularPartners::RegularPartners<diy::RegularDecomposer<diy::Bounds<int>>>
            ((RegularPartners *)&this->histogram,&this->decomposer,2,true);
  RegularPartners::RegularPartners<diy::RegularDecomposer<diy::Bounds<int>>>
            (&(this->swap).super_RegularPartners,&this->decomposer,2,false);
  this_00 = &this->rounds_;
  this_01 = &this->dim_;
  (this->dim_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->dim_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->rounds_).super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dim_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->rounds_).super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rounds_).super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->wrap = wrap_;
  Bounds<float>::Bounds(&this->domain,domain_);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)(this->swap).super_RegularPartners.kvs_.
                            super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->swap).super_RegularPartners.kvs_.
                            super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    uVar7 = (uint)uVar8;
    pDVar2 = (this->histogram).super_RegularMergePartners.super_RegularPartners.kvs_.
             super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pDVar1 = *(pointer *)
              ((long)&(this->histogram).super_RegularMergePartners.super_RegularPartners.kvs_.
                      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                      ._M_impl.super__Vector_impl_data + 8);
    iVar4 = 0;
    while( true ) {
      uVar6 = (ulong)iVar4;
      if ((ulong)((long)pDVar1 - (long)pDVar2 >> 2) <= uVar6) break;
      local_108.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ = uVar6 << 0x20;
      std::vector<std::pair<bool,int>,std::allocator<std::pair<bool,int>>>::
      emplace_back<std::pair<bool,int>>
                ((vector<std::pair<bool,int>,std::allocator<std::pair<bool,int>>> *)this_00,
                 (pair<bool,_int> *)&local_108);
      local_108.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_4_ =
           (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) % (long)dim)
      ;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_108);
      pDVar2 = (this->histogram).super_RegularMergePartners.super_RegularPartners.kvs_.
               super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pDVar1 = *(pointer *)
                ((long)&(this->histogram).super_RegularMergePartners.super_RegularPartners.kvs_.
                        super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                        ._M_impl.super__Vector_impl_data + 8);
      iVar3 = 0;
      if (((ulong)((long)pDVar1 - (long)pDVar2 >> 2) >> 1) + (long)(int)~uVar7 == uVar6) {
        iVar3 = uVar7 * 2;
      }
      iVar4 = iVar3 + iVar4 + 1;
    }
    local_108.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ =
         (uVar8 << 0x20) + 1;
    std::vector<std::pair<bool,int>,std::allocator<std::pair<bool,int>>>::
    emplace_back<std::pair<bool,int>>
              ((vector<std::pair<bool,int>,std::allocator<std::pair<bool,int>>> *)this_00,
               (pair<bool,_int> *)&local_108);
    uVar5 = (undefined4)
            ((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) % (long)dim);
    local_108.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_4_ = uVar5;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_108);
    local_108.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ = 0xffffffff00000001
    ;
    std::vector<std::pair<bool,int>,std::allocator<std::pair<bool,int>>>::
    emplace_back<std::pair<bool,int>>
              ((vector<std::pair<bool,int>,std::allocator<std::pair<bool,int>>> *)this_00,
               (pair<bool,_int> *)&local_108);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_01,(int *)&local_108);
  }
  return;
}

Assistant:

KDTreePartners(int dim, int nblocks, bool wrap_, const Bounds& domain_):
                        decomposer(1, interval(0,nblocks-1), nblocks),
                        histogram(decomposer, 2),
                        swap(decomposer, 2, false),
                        wrap(wrap_),
                        domain(domain_)
  {
    for (int i = 0; i < swap.rounds(); ++i)
    {
      // fill histogram rounds
      for (int j = 0; j < histogram.rounds(); ++j)
      {
        rounds_.push_back(std::make_pair(false, j));
        dim_.push_back(i % dim);
        if (j == histogram.rounds() / 2 - 1 - i)
            j += 2*i;
      }

      // fill swap round
      rounds_.push_back(std::make_pair(true, i));
      dim_.push_back(i % dim);

      // fill link round
      rounds_.push_back(std::make_pair(true, -1));          // (true, -1) signals link round
      dim_.push_back(i % dim);
    }
  }